

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_write_attributes_uint64(void *a,uint64_t *attrib,uint32_t nr_of_attribs)

{
  ssize_t sVar1;
  uint local_40c0;
  uint local_40bc;
  char *pcStack_40b8;
  uint32_t bytes_written;
  uint8_t *compressed_buf;
  LZ4_stream_t **ppLStack_40a8;
  uint estimateLen;
  LZ4_stream_t *lz4Stream;
  LZ4_stream_t lz4Stream_body;
  uint8_t *b8;
  uint8_t *b7;
  uint8_t *b6;
  uint8_t *b5;
  uint8_t *b4;
  uint8_t *b3;
  uint8_t *b2;
  uint8_t *b1;
  void *pvStack_38;
  uint8_t header;
  trico_archive *arch;
  uint64_t *puStack_28;
  uint32_t nr_of_attribs_local;
  uint64_t *attrib_local;
  void *a_local;
  
  b1._7_1_ = 0x14;
  pvStack_38 = a;
  arch._4_4_ = nr_of_attribs;
  puStack_28 = attrib;
  attrib_local = (uint64_t *)a;
  sVar1 = write((int)&b1 + 7,(void *)0x1,1);
  if ((int)sVar1 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    sVar1 = write((int)&arch + 4,(void *)0x4,1);
    if ((int)sVar1 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      b2 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      b3 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      b4 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      b5 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      b6 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      b7 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      b8 = (uint8_t *)trico_malloc((ulong)arch._4_4_);
      lz4Stream_body.table[0x803] = (unsigned_long_long)trico_malloc((ulong)arch._4_4_);
      trico_transpose_uint64_aos_to_soa
                (&b2,&b3,&b4,&b5,&b6,&b7,&b8,(uint8_t **)(lz4Stream_body.table + 0x803),puStack_28,
                 arch._4_4_);
      ppLStack_40a8 = &lz4Stream;
      LZ4_initStream(ppLStack_40a8,0x4020);
      if (arch._4_4_ < 0x7e000001) {
        local_40c0 = arch._4_4_ + arch._4_4_ / 0xff + 0x10;
      }
      else {
        local_40c0 = 0;
      }
      compressed_buf._4_4_ = local_40c0;
      pcStack_40b8 = (char *)trico_malloc((ulong)local_40c0);
      local_40bc = LZ4_compress_default((char *)b2,pcStack_40b8,arch._4_4_,compressed_buf._4_4_);
      sVar1 = write((int)&local_40bc,(void *)0x4,1);
      if ((int)sVar1 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        sVar1 = write((int)pcStack_40b8,(void *)0x1,(ulong)local_40bc);
        if ((int)sVar1 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          local_40bc = LZ4_compress_default((char *)b3,pcStack_40b8,arch._4_4_,compressed_buf._4_4_)
          ;
          sVar1 = write((int)&local_40bc,(void *)0x4,1);
          if ((int)sVar1 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            sVar1 = write((int)pcStack_40b8,(void *)0x1,(ulong)local_40bc);
            if ((int)sVar1 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              local_40bc = LZ4_compress_default
                                     ((char *)b4,pcStack_40b8,arch._4_4_,compressed_buf._4_4_);
              sVar1 = write((int)&local_40bc,(void *)0x4,1);
              if ((int)sVar1 == 0) {
                a_local._4_4_ = 0;
              }
              else {
                sVar1 = write((int)pcStack_40b8,(void *)0x1,(ulong)local_40bc);
                if ((int)sVar1 == 0) {
                  a_local._4_4_ = 0;
                }
                else {
                  local_40bc = LZ4_compress_default
                                         ((char *)b5,pcStack_40b8,arch._4_4_,compressed_buf._4_4_);
                  sVar1 = write((int)&local_40bc,(void *)0x4,1);
                  if ((int)sVar1 == 0) {
                    a_local._4_4_ = 0;
                  }
                  else {
                    sVar1 = write((int)pcStack_40b8,(void *)0x1,(ulong)local_40bc);
                    if ((int)sVar1 == 0) {
                      a_local._4_4_ = 0;
                    }
                    else {
                      local_40bc = LZ4_compress_default
                                             ((char *)b6,pcStack_40b8,arch._4_4_,
                                              compressed_buf._4_4_);
                      sVar1 = write((int)&local_40bc,(void *)0x4,1);
                      if ((int)sVar1 == 0) {
                        a_local._4_4_ = 0;
                      }
                      else {
                        sVar1 = write((int)pcStack_40b8,(void *)0x1,(ulong)local_40bc);
                        if ((int)sVar1 == 0) {
                          a_local._4_4_ = 0;
                        }
                        else {
                          local_40bc = LZ4_compress_default
                                                 ((char *)b7,pcStack_40b8,arch._4_4_,
                                                  compressed_buf._4_4_);
                          sVar1 = write((int)&local_40bc,(void *)0x4,1);
                          if ((int)sVar1 == 0) {
                            a_local._4_4_ = 0;
                          }
                          else {
                            sVar1 = write((int)pcStack_40b8,(void *)0x1,(ulong)local_40bc);
                            if ((int)sVar1 == 0) {
                              a_local._4_4_ = 0;
                            }
                            else {
                              local_40bc = LZ4_compress_default
                                                     ((char *)b8,pcStack_40b8,arch._4_4_,
                                                      compressed_buf._4_4_);
                              sVar1 = write((int)&local_40bc,(void *)0x4,1);
                              if ((int)sVar1 == 0) {
                                a_local._4_4_ = 0;
                              }
                              else {
                                sVar1 = write((int)pcStack_40b8,(void *)0x1,(ulong)local_40bc);
                                if ((int)sVar1 == 0) {
                                  a_local._4_4_ = 0;
                                }
                                else {
                                  local_40bc = LZ4_compress_default
                                                         ((char *)lz4Stream_body.table[0x803],
                                                          pcStack_40b8,arch._4_4_,
                                                          compressed_buf._4_4_);
                                  sVar1 = write((int)&local_40bc,(void *)0x4,1);
                                  if ((int)sVar1 == 0) {
                                    a_local._4_4_ = 0;
                                  }
                                  else {
                                    sVar1 = write((int)pcStack_40b8,(void *)0x1,(ulong)local_40bc);
                                    if ((int)sVar1 == 0) {
                                      a_local._4_4_ = 0;
                                    }
                                    else {
                                      trico_free(pcStack_40b8);
                                      trico_free(b2);
                                      trico_free(b3);
                                      trico_free(b4);
                                      trico_free(b5);
                                      trico_free(b6);
                                      trico_free(b7);
                                      trico_free(b8);
                                      trico_free((void *)lz4Stream_body.table[0x803]);
                                      a_local._4_4_ = 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

int trico_write_attributes_uint64(void* a, const uint64_t* attrib, uint32_t nr_of_attribs)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)trico_attribute_uint64_stream;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint8_t* b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b4 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b5 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b6 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b7 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint8_t* b8 = (uint8_t*)trico_malloc(nr_of_attribs);

  trico_transpose_uint64_aos_to_soa(&b1, &b2, &b3, &b4, &b5, &b6, &b7, &b8, attrib, nr_of_attribs);


  LZ4_stream_t lz4Stream_body;
  LZ4_stream_t* lz4Stream = &lz4Stream_body;
  LZ4_initStream(lz4Stream, sizeof(*lz4Stream));

  unsigned estimateLen = LZ4_COMPRESSBOUND(nr_of_attribs);
  uint8_t* compressed_buf = (uint8_t*)trico_malloc(estimateLen);

  uint32_t bytes_written = (uint32_t)LZ4_compress_default((const char*)b1, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b2, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b3, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b4, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b5, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b6, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b7, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  bytes_written = (uint32_t)LZ4_compress_default((const char*)b8, (char*)compressed_buf, (int)nr_of_attribs, (int)estimateLen);
  if (!write(&bytes_written, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_buf, 1, bytes_written, arch))
    return 0;

  trico_free(compressed_buf);

  trico_free(b1);
  trico_free(b2);
  trico_free(b3);
  trico_free(b4);
  trico_free(b5);
  trico_free(b6);
  trico_free(b7);
  trico_free(b8);

  return 1;
  }